

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::BasicTexImageCubeCase::createTexture(BasicTexImageCubeCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 internalFormat;
  deUint32 format;
  deUint32 type;
  deUint32 dVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int ndx;
  long lVar7;
  float fVar8;
  deUint32 tex;
  int local_cc;
  ulong local_c8;
  ContextWrapper *local_c0;
  Vec4 gMax;
  Vec4 gMin;
  TextureLevel levelData;
  Random rnd;
  PixelBufferAccess local_58;
  
  tex = 0;
  local_58.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_58);
  dVar3 = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_c0 = this_00;
  if (0 < (this->super_TextureCubeSpecCase).m_numLevels) {
    uVar5 = 0;
    do {
      local_cc = (this->super_TextureCubeSpecCase).m_size >> ((byte)uVar5 & 0x1f);
      if (local_cc < 2) {
        local_cc = 1;
      }
      local_c8 = uVar5;
      tcu::TextureLevel::setSize(&levelData,local_cc,local_cc,1);
      lVar6 = 0;
      do {
        gMin.m_data[0] = 0.0;
        gMin.m_data[1] = 0.0;
        gMin.m_data[2] = 0.0;
        gMin.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          fVar1 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar7];
          fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar7];
          fVar8 = deRandom_getFloat(&rnd.m_rnd);
          gMin.m_data[lVar7] = (fVar2 - fVar1) * fVar8 + fVar1;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        gMax.m_data[0] = 0.0;
        gMax.m_data[1] = 0.0;
        gMax.m_data[2] = 0.0;
        gMax.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          fVar1 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar7];
          fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar7];
          fVar8 = deRandom_getFloat(&rnd.m_rnd);
          gMax.m_data[lVar7] = (fVar2 - fVar1) * fVar8 + fVar1;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        tcu::TextureLevel::getAccess(&local_58,&levelData);
        tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
        dVar3 = (&s_cubeMapFaces)[lVar6];
        internalFormat = this->m_internalFormat;
        format = this->m_format;
        type = this->m_dataType;
        tcu::TextureLevel::getAccess(&local_58,&levelData);
        sglr::ContextWrapper::glTexImage2D
                  (local_c0,dVar3,(int)local_c8,internalFormat,local_cc,local_cc,0,format,type,
                   local_58.super_ConstPixelBufferAccess.m_data);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      uVar4 = (int)local_c8 + 1;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < (this->super_TextureCubeSpecCase).m_numLevels);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(m_format, m_dataType));
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			levelData.setSize(levelSize, levelSize);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
				Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

				tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

				glTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
			}
		}
	}